

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O2

void __thiscall options2::options2(options2 *this,uint argc,char **argv)

{
  string *this_00;
  string *this_01;
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong local_98;
  allocator local_8a;
  allocator local_89;
  string *local_88;
  string local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->valid = true;
  this->prec = 0xf;
  this_00 = &this->Jx;
  std::__cxx11::string::string((string *)this_00,"1",(allocator *)&local_80);
  this_01 = &this->Jy;
  std::__cxx11::string::string((string *)this_01,"1",(allocator *)&local_80);
  (this->Tmin)._M_dataplus._M_p = (pointer)&(this->Tmin).field_2;
  (this->Tmin)._M_string_length = 0;
  (this->Tmin).field_2._M_local_buf[0] = '\0';
  (this->Tmax)._M_dataplus._M_p = (pointer)&(this->Tmax).field_2;
  (this->Tmax)._M_string_length = 0;
  (this->Tmax).field_2._M_local_buf[0] = '\0';
  (this->dT)._M_dataplus._M_p = (pointer)&(this->dT).field_2;
  (this->dT)._M_string_length = 0;
  local_58 = &this->dT;
  (this->dT).field_2._M_local_buf[0] = '\0';
  if (argc == 1) {
    help_abi_cxx11_(&local_80,this,*argv);
    std::operator<<((ostream *)&std::cerr,(string *)&local_80);
LAB_00117f51:
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    local_98 = 2;
    local_88 = (string *)&this->Tmax;
    local_60 = (string *)&this->Tmin;
    for (uVar4 = 1; uVar4 < argc; uVar4 = uVar4 + 2) {
      std::__cxx11::string::string((string *)&local_80,argv[uVar4],&local_89);
      bVar2 = std::operator==(&local_80,"-h");
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_80);
LAB_00117e93:
        help_abi_cxx11_(&local_80,this,*argv);
        std::operator<<((ostream *)&std::cerr,(string *)&local_80);
        goto LAB_00117f51;
      }
      std::__cxx11::string::string((string *)&local_50,argv[uVar4],&local_8a);
      bVar2 = std::operator==(&local_50,"--help");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar2) goto LAB_00117e93;
      pcVar1 = argv[uVar4];
      if (*pcVar1 != '-') {
        switch(~uVar4 + argc) {
        case 0:
          std::__cxx11::string::assign((char *)this_01);
          std::__cxx11::string::_M_assign((string *)this_00);
          break;
        case 1:
          std::__cxx11::string::assign((char *)this_01);
          std::__cxx11::string::_M_assign((string *)this_00);
          break;
        case 2:
          std::__cxx11::string::assign((char *)this_00);
          std::__cxx11::string::assign((char *)this_01);
          break;
        default:
          help_abi_cxx11_(&local_80,this,*argv);
          std::operator<<((ostream *)&std::cerr,(string *)&local_80);
          goto LAB_00117f51;
        case 4:
          std::__cxx11::string::assign((char *)this_00);
          std::__cxx11::string::assign((char *)this_01);
          std::__cxx11::string::assign((char *)local_60);
          std::__cxx11::string::assign((char *)local_88);
          std::__cxx11::string::assign((char *)local_58);
          return;
        }
        std::__cxx11::string::assign((char *)local_58);
        std::__cxx11::string::_M_assign(local_88);
        std::__cxx11::string::_M_assign(local_60);
        return;
      }
      if (pcVar1[1] != 'p') {
        help_abi_cxx11_(&local_80,this,*argv);
        std::operator<<((ostream *)&std::cerr,(string *)&local_80);
        goto LAB_00117f51;
      }
      if (uVar4 + 1 == argc) {
        help_abi_cxx11_(&local_80,this,*argv);
        std::operator<<((ostream *)&std::cerr,(string *)&local_80);
        goto LAB_00117f51;
      }
      uVar3 = atoi(argv[local_98]);
      this->prec = uVar3;
      local_98 = (ulong)((int)local_98 + 2);
    }
  }
  return;
}

Assistant:

options2(unsigned argc, char *argv[])
      : valid(true), prec(15), Jx("1"), Jy("1") {
    if (argc == 1) {
      std::cerr << help(argv[0]);
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      if (std::string(argv[i]) == "-h" || std::string(argv[i]) == "--help") {
        std::cerr << help(argv[0]);
        return;
      }
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                std::cerr << help(argv[0]);
                return;
              }
              prec = atoi(argv[i]);
              break;
            default:
              std::cerr << help(argv[0]);
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Jx = Jy = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Jx = Jy = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 3:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = Tmax = dT = argv[i + 2];
              return;
            case 5:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = argv[i + 2];
              Tmax = argv[i + 3];
              dT = argv[i + 4];
              return;
            default:
              std::cerr << help(argv[0]);
              return;
          }
      }
    }
  }